

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O0

EncodeNumberStatus
spvtools::utils::ParseAndEncodeIntegerNumber
          (char *text,NumberType *type,function<void_(unsigned_int)> *emit,string *error_msg)

{
  ulong uVar1;
  bool bVar2;
  ErrorMsgStream *pEVar3;
  char *pcVar4;
  _func_ios_base_ptr_ios_base_ptr *local_118;
  _func_ios_base_ptr_ios_base_ptr *local_100;
  bool local_ea;
  bool local_e9;
  uint32_t high;
  uint32_t low;
  ErrorMsgStream local_c8;
  ErrorMsgStream local_b8;
  ErrorMsgStream local_a8;
  long local_98;
  int64_t decoded_signed;
  uint64_t decoded_bits;
  undefined1 local_80 [7];
  bool is_hex;
  undefined1 local_6a;
  byte local_69;
  undefined1 local_68 [6];
  bool can_be_signed;
  bool is_negative;
  uint local_54;
  undefined1 local_50 [4];
  uint32_t bit_width;
  ErrorMsgStream local_40;
  string *local_30;
  string *error_msg_local;
  function<void_(unsigned_int)> *emit_local;
  NumberType *type_local;
  char *text_local;
  
  local_30 = error_msg;
  error_msg_local = (string *)emit;
  emit_local = (function<void_(unsigned_int)> *)type;
  type_local = (NumberType *)text;
  if (text == (char *)0x0) {
    anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_40,error_msg);
    (anonymous_namespace)::ErrorMsgStream::operator<<
              ((ErrorMsgStream *)&local_40,"The given text is a nullptr");
    anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_40);
    text_local._4_4_ = kInvalidText;
  }
  else {
    bVar2 = IsIntegral(type);
    if (bVar2) {
      local_54 = AssumedBitWidth((NumberType *)emit_local);
      if (local_54 < 0x41) {
        local_69 = (char)type_local->bitwidth == '-';
        local_6a = IsSigned((NumberType *)emit_local);
        if (((local_69 & 1) == 0) || ((bool)local_6a)) {
          local_e9 = false;
          if ((char)type_local->bitwidth == '0') {
            local_ea = true;
            if (*(char *)((long)&type_local->bitwidth + 1) != 'x') {
              local_ea = *(char *)((long)&type_local->bitwidth + 1) == 'X';
            }
            local_e9 = local_ea;
          }
          decoded_bits._7_1_ = local_e9;
          if ((local_69 & 1) == 0) {
            bVar2 = ParseNumber<unsigned_long>((char *)type_local,(unsigned_long *)&decoded_signed);
            if (!bVar2) {
              anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_c8,local_30);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)&local_c8,"Invalid unsigned integer literal: ");
              (anonymous_namespace)::ErrorMsgStream::operator<<
                        ((ErrorMsgStream *)pEVar3,(char *)type_local);
              anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_c8);
              return kInvalidText;
            }
            bVar2 = CheckRangeAndIfHexThenSignExtend<unsigned_long>
                              (decoded_signed,(NumberType *)emit_local,
                               (bool)(decoded_bits._7_1_ & 1),(unsigned_long *)&decoded_signed);
            if (!bVar2) {
              anon_unknown_11::ErrorMsgStream::ErrorMsgStream((ErrorMsgStream *)&high,local_30);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)&high,"Integer ");
              if ((decoded_bits._7_1_ & 1) == 0) {
                local_118 = std::dec;
              }
              else {
                local_118 = std::hex;
              }
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,local_118);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,std::showbase);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,decoded_signed);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3," does not fit in a ");
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,std::dec);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,local_54);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,"-bit ");
              bVar2 = IsSigned((NumberType *)emit_local);
              pcVar4 = "unsigned";
              if (bVar2) {
                pcVar4 = "signed";
              }
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,pcVar4);
              (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)pEVar3," integer")
              ;
              anon_unknown_11::ErrorMsgStream::~ErrorMsgStream((ErrorMsgStream *)&high);
              return kInvalidText;
            }
          }
          else {
            local_98 = 0;
            bVar2 = ParseNumber<long>((char *)type_local,&local_98);
            if (!bVar2) {
              anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_a8,local_30);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)&local_a8,"Invalid signed integer literal: ");
              (anonymous_namespace)::ErrorMsgStream::operator<<
                        ((ErrorMsgStream *)pEVar3,(char *)type_local);
              anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_a8);
              return kInvalidText;
            }
            bVar2 = CheckRangeAndIfHexThenSignExtend<long>
                              (local_98,(NumberType *)emit_local,(bool)(decoded_bits._7_1_ & 1),
                               &local_98);
            if (!bVar2) {
              anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_b8,local_30);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)&local_b8,"Integer ");
              if ((decoded_bits._7_1_ & 1) == 0) {
                local_100 = std::dec;
              }
              else {
                local_100 = std::hex;
              }
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,local_100);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,std::showbase);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,local_98);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3," does not fit in a ");
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,std::dec);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,local_54);
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,"-bit ");
              bVar2 = IsSigned((NumberType *)emit_local);
              pcVar4 = "unsigned";
              if (bVar2) {
                pcVar4 = "signed";
              }
              pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                                 ((ErrorMsgStream *)pEVar3,pcVar4);
              (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)pEVar3," integer")
              ;
              anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_b8);
              return kInvalidText;
            }
            decoded_signed = local_98;
          }
          if (local_54 < 0x21) {
            std::function<void_(unsigned_int)>::operator()(emit,(uint)decoded_signed);
          }
          else {
            uVar1 = (ulong)decoded_signed >> 0x20;
            std::function<void_(unsigned_int)>::operator()(emit,(uint)decoded_signed);
            std::function<void_(unsigned_int)>::operator()(emit,(uint)uVar1);
          }
          text_local._4_4_ = kSuccess;
        }
        else {
          anon_unknown_11::ErrorMsgStream::ErrorMsgStream((ErrorMsgStream *)local_80,local_30);
          (anonymous_namespace)::ErrorMsgStream::operator<<
                    ((ErrorMsgStream *)local_80,
                     "Cannot put a negative number in an unsigned literal");
          anon_unknown_11::ErrorMsgStream::~ErrorMsgStream((ErrorMsgStream *)local_80);
          text_local._4_4_ = kInvalidUsage;
        }
      }
      else {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream((ErrorMsgStream *)local_68,local_30);
        pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                           ((ErrorMsgStream *)local_68,"Unsupported ");
        pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                           ((ErrorMsgStream *)pEVar3,local_54);
        (anonymous_namespace)::ErrorMsgStream::operator<<
                  ((ErrorMsgStream *)pEVar3,"-bit integer literals");
        anon_unknown_11::ErrorMsgStream::~ErrorMsgStream((ErrorMsgStream *)local_68);
        text_local._4_4_ = kUnsupported;
      }
    }
    else {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream((ErrorMsgStream *)local_50,local_30);
      (anonymous_namespace)::ErrorMsgStream::operator<<
                ((ErrorMsgStream *)local_50,"The expected type is not a integer type");
      anon_unknown_11::ErrorMsgStream::~ErrorMsgStream((ErrorMsgStream *)local_50);
      text_local._4_4_ = kInvalidUsage;
    }
  }
  return text_local._4_4_;
}

Assistant:

EncodeNumberStatus ParseAndEncodeIntegerNumber(
    const char* text, const NumberType& type,
    std::function<void(uint32_t)> emit, std::string* error_msg) {
  if (!text) {
    ErrorMsgStream(error_msg) << "The given text is a nullptr";
    return EncodeNumberStatus::kInvalidText;
  }

  if (!IsIntegral(type)) {
    ErrorMsgStream(error_msg) << "The expected type is not a integer type";
    return EncodeNumberStatus::kInvalidUsage;
  }

  const uint32_t bit_width = AssumedBitWidth(type);

  if (bit_width > 64) {
    ErrorMsgStream(error_msg)
        << "Unsupported " << bit_width << "-bit integer literals";
    return EncodeNumberStatus::kUnsupported;
  }

  // Either we are expecting anything or integer.
  bool is_negative = text[0] == '-';
  bool can_be_signed = IsSigned(type);

  if (is_negative && !can_be_signed) {
    ErrorMsgStream(error_msg)
        << "Cannot put a negative number in an unsigned literal";
    return EncodeNumberStatus::kInvalidUsage;
  }

  const bool is_hex = text[0] == '0' && (text[1] == 'x' || text[1] == 'X');

  uint64_t decoded_bits;
  if (is_negative) {
    int64_t decoded_signed = 0;

    if (!ParseNumber(text, &decoded_signed)) {
      ErrorMsgStream(error_msg) << "Invalid signed integer literal: " << text;
      return EncodeNumberStatus::kInvalidText;
    }

    if (!CheckRangeAndIfHexThenSignExtend(decoded_signed, type, is_hex,
                                          &decoded_signed)) {
      ErrorMsgStream(error_msg)
          << "Integer " << (is_hex ? std::hex : std::dec) << std::showbase
          << decoded_signed << " does not fit in a " << std::dec << bit_width
          << "-bit " << (IsSigned(type) ? "signed" : "unsigned") << " integer";
      return EncodeNumberStatus::kInvalidText;
    }
    decoded_bits = decoded_signed;
  } else {
    // There's no leading minus sign, so parse it as an unsigned integer.
    if (!ParseNumber(text, &decoded_bits)) {
      ErrorMsgStream(error_msg) << "Invalid unsigned integer literal: " << text;
      return EncodeNumberStatus::kInvalidText;
    }
    if (!CheckRangeAndIfHexThenSignExtend(decoded_bits, type, is_hex,
                                          &decoded_bits)) {
      ErrorMsgStream(error_msg)
          << "Integer " << (is_hex ? std::hex : std::dec) << std::showbase
          << decoded_bits << " does not fit in a " << std::dec << bit_width
          << "-bit " << (IsSigned(type) ? "signed" : "unsigned") << " integer";
      return EncodeNumberStatus::kInvalidText;
    }
  }
  if (bit_width > 32) {
    uint32_t low = uint32_t(0x00000000ffffffff & decoded_bits);
    uint32_t high = uint32_t((0xffffffff00000000 & decoded_bits) >> 32);
    emit(low);
    emit(high);
  } else {
    emit(uint32_t(decoded_bits));
  }
  return EncodeNumberStatus::kSuccess;
}